

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.h
# Opt level: O0

string * __thiscall pbrt::syntactic::Token::toString_abi_cxx11_(Token *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Loc *in_stack_00000068;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  __lhs = in_RDI;
  Loc::toString_abi_cxx11_(in_stack_00000068);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  return __lhs;
}

Assistant:

std::string toString() const { return loc.toString() + ": '" + text + "'"; }